

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

omittable_field<discordpp::Snowflake> * __thiscall
discordpp::omittable_field<discordpp::Snowflake>::operator=
          (omittable_field<discordpp::Snowflake> *this)

{
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  (this->super_field<discordpp::Snowflake>).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
  if (_Var1._M_head_impl != (Snowflake *)0x0) {
    operator_delete(_Var1._M_head_impl,8);
  }
  (this->super_field<discordpp::Snowflake>).s_ = omitted_e;
  return this;
}

Assistant:

virtual omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }